

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O2

bool __thiscall
icu_63::double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  uint64_t uVar1;
  ulong uVar2;
  byte bVar3;
  undefined4 in_register_0000000c;
  double *number_of_read_digits;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  DiyFp diy_fp;
  DiyFp local_68;
  int cached_decimal_exponent;
  DiyFp cached_power;
  DiyFp local_40;
  
  number_of_read_digits = (double *)CONCAT44(in_register_0000000c,exponent);
  uVar7 = (uint)trimmed.start_;
  if (uVar7 == 0) goto LAB_00272aab;
  uVar4 = trimmed.length_;
  if (0x135 < (int)(uVar4 + uVar7)) {
    *number_of_read_digits = INFINITY;
    return true;
  }
  if ((int)(uVar4 + uVar7) < -0x143) goto LAB_00272aab;
  if (0xf < (int)uVar7) goto LAB_00272a3e;
  if (0xffffffe9 < uVar4) {
    buffer.start_ = (char *)(ulong)uVar7;
    buffer._8_8_ = &local_68;
    uVar1 = ReadUint64(this,buffer,(int *)number_of_read_digits);
    auVar13._8_4_ = (int)(uVar1 >> 0x20);
    auVar13._0_8_ = uVar1;
    auVar13._12_4_ = 0x45300000;
    dVar12 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
             *(double *)(exact_powers_of_ten + (ulong)-uVar4 * 8);
    goto LAB_00272a38;
  }
  if (uVar4 < 0x17) {
    buffer_00.start_ = (char *)(ulong)uVar7;
    buffer_00._8_8_ = &local_68;
    uVar1 = ReadUint64(this,buffer_00,(int *)number_of_read_digits);
    auVar14._8_4_ = (int)(uVar1 >> 0x20);
    auVar14._0_8_ = uVar1;
    auVar14._12_4_ = 0x45300000;
    dVar12 = (auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    uVar2 = (ulong)uVar4;
LAB_00272a33:
    dVar12 = dVar12 * *(double *)(exact_powers_of_ten + uVar2 * 8);
LAB_00272a38:
    *number_of_read_digits = dVar12;
    return true;
  }
  if (-1 < (int)uVar4) {
    iVar6 = uVar4 - (0xf - uVar7);
    if (iVar6 < 0x17) {
      buffer_01.start_ = (char *)(ulong)uVar7;
      buffer_01._8_8_ = &local_68;
      uVar1 = ReadUint64(this,buffer_01,(int *)number_of_read_digits);
      auVar15._8_4_ = (int)(uVar1 >> 0x20);
      auVar15._0_8_ = uVar1;
      auVar15._12_4_ = 0x45300000;
      dVar12 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
               *(double *)(exact_powers_of_ten + (ulong)(0xf - uVar7) * 8);
      uVar2 = (ulong)iVar6;
      goto LAB_00272a33;
    }
  }
LAB_00272a3e:
  buffer_02.start_ = (char *)(ulong)uVar7;
  buffer_02._8_8_ = &cached_power;
  local_68.f_ = ReadUint64(this,buffer_02,(int *)number_of_read_digits);
  if (uVar7 == (uint)cached_power.f_) {
    iVar6 = 0;
  }
  else {
    local_68.f_ = local_68.f_ + ('4' < (char)this[(int)(uint)cached_power.f_]);
    iVar6 = uVar7 - (uint)cached_power.f_;
  }
  local_68.e_ = 0;
  iVar9 = uVar4 + iVar6;
  DiyFp::Normalize(&local_68);
  lVar8 = ((ulong)(iVar6 != 0) << 2) << (-(char)local_68.e_ & 0x3fU);
  if (-0x15d < iVar9) {
    cached_power.f_ = 0;
    cached_power.e_ = 0;
    PowersOfTenCache::GetCachedPowerForDecimalExponent(iVar9,&cached_power,&cached_decimal_exponent)
    ;
    iVar9 = iVar9 - cached_decimal_exponent;
    if (iVar9 != 0) {
      uVar4 = iVar9 - 1;
      if (6 < uVar4) {
        abort();
      }
      local_40.e_ = *(int *)(&DAT_00306708 + (ulong)uVar4 * 4);
      local_40.f_ = *(uint64_t *)(&DAT_00306728 + (ulong)uVar4 * 8);
      DiyFp::Multiply(&local_68,&local_40);
      if ((int)(0x13 - uVar7) < iVar9) {
        lVar8 = lVar8 + 4;
      }
    }
    DiyFp::Multiply(&local_68,&cached_power);
    iVar6 = local_68.e_;
    DiyFp::Normalize(&local_68);
    uVar11 = (9 - (ulong)(lVar8 == 0)) + lVar8 << ((char)iVar6 - (char)local_68.e_ & 0x3fU);
    uVar2 = 0;
    if (0xfffffbce < local_68.e_ + 0x40U) {
      uVar2 = (ulong)(local_68.e_ + 0x472);
    }
    uVar5 = 0x35;
    if (local_68.e_ < -0x43d) {
      uVar5 = uVar2;
    }
    iVar6 = (int)uVar5;
    if (iVar6 < 4) {
      bVar3 = (byte)(4 - iVar6);
      local_68.f_ = local_68.f_ >> (bVar3 & 0x3f);
      local_68.e_ = (4 - iVar6) + local_68.e_;
      uVar5 = (ulong)(uint)local_68.e_;
      uVar11 = (uVar11 >> (bVar3 & 0x3f)) + 9;
      iVar6 = 0x3c;
    }
    else {
      iVar6 = 0x40 - iVar6;
    }
    bVar3 = (byte)iVar6;
    uVar10 = (~(-1L << (bVar3 & 0x3f)) & local_68.f_) << 3;
    lVar8 = 8L << (bVar3 - 1 & 0x3f);
    diy_fp.f_ = (ulong)(uint)(local_68.e_ + iVar6);
    uVar2 = uVar11 + lVar8;
    diy_fp._8_8_ = uVar5;
    dVar12 = (double)Double::DiyFpToUint64
                               ((Double *)
                                (((local_68.f_ >> (bVar3 & 0x3f)) + 1) - (ulong)(uVar10 < uVar2)),
                                diy_fp);
    *number_of_read_digits = dVar12;
    if (lVar8 - uVar11 < uVar10) {
      if (uVar10 < uVar2) {
        return INFINITY <= dVar12;
      }
      return true;
    }
    return true;
  }
LAB_00272aab:
  *number_of_read_digits = 0.0;
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}